

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O2

void __thiscall
F2DDrawer::AddPoly(F2DDrawer *this,FTexture *texture,FVector2 *points,int npoints,double originx,
                  double originy,double scalex,double scaley,DAngle *rotation,
                  FDynamicColormap *colormap,int lightlevel)

{
  double dVar1;
  FVector2 FVar2;
  FSimpleVertex *pFVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  DataSimplePoly poly;
  DataGeneric local_b0;
  FMaterial *local_a0;
  int local_98;
  FDynamicColormap *local_90;
  float local_88;
  float local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_40;
  double local_38;
  
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = originy;
  local_58._12_4_ = in_XMM1_Dd;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = originx;
  local_68._12_4_ = in_XMM0_Dd;
  local_a0 = FMaterial::ValidateTexture(texture,false);
  if (local_a0 != (FMaterial *)0x0) {
    local_b0.mType = DrawTypePoly;
    local_b0.mLen = 0x28;
    local_98 = lightlevel;
    local_b0.mVertCount = npoints;
    local_90 = colormap;
    uVar4 = TArray<FSimpleVertex,_FSimpleVertex>::Reserve(&this->mVertices,npoints);
    dVar1 = rotation->Degrees;
    local_b0.mVertIndex = uVar4;
    sincos(dVar1 * 0.017453292519943295,&local_38,&local_40);
    local_78 = (float)local_40;
    local_88 = (float)local_38;
    iVar5 = FTexture::GetScaledWidth(texture);
    iVar6 = FTexture::GetScaledHeight(texture);
    fVar9 = (float)(1.0 / ((double)iVar6 * scaley));
    if ((texture->field_0x31 & 0x20) != 0) {
      fVar9 = -fVar9;
    }
    uVar7 = 0;
    if (npoints < 1) {
      npoints = 0;
    }
    lVar8 = (long)(int)uVar4 * 0x18;
    for (; (uint)npoints != uVar7; uVar7 = uVar7 + 1) {
      FVar2 = points[uVar7];
      fVar10 = (-0.5 - (float)(double)local_68._0_8_) + FVar2.X;
      fVar12 = (-0.5 - (float)(double)local_58._0_8_) + FVar2.Y;
      if (dVar1 != 0.0) {
        fVar11 = fVar10 * local_88;
        fVar10 = fVar10 * local_78 - fVar12 * local_88;
        fVar12 = fVar11 + fVar12 * local_78;
      }
      pFVar3 = (this->mVertices).Array;
      *(FVector2 *)((long)&pFVar3->x + lVar8) = FVar2;
      *(undefined4 *)((long)&pFVar3->y + lVar8) = 0;
      *(ulong *)((long)&pFVar3->u + lVar8) =
           CONCAT44(fVar12 * fVar9,fVar10 * (float)(1.0 / ((double)iVar5 * scalex)));
      *(undefined4 *)((long)&(pFVar3->color).field_0 + lVar8) = 0xffffffff;
      lVar8 = lVar8 + 0x18;
    }
    AddData(this,&local_b0);
  }
  return;
}

Assistant:

void F2DDrawer::AddPoly(FTexture *texture, FVector2 *points, int npoints,
		double originx, double originy, double scalex, double scaley,
		DAngle rotation, FDynamicColormap *colormap, int lightlevel)
{
	FMaterial *gltexture = FMaterial::ValidateTexture(texture, false);

	if (gltexture == nullptr)
	{
		return;
	}
	DataSimplePoly poly;

	poly.mType = DrawTypePoly;
	poly.mLen = (sizeof(poly) + 7) & ~7;
	poly.mTexture = gltexture;
	poly.mColormap = colormap;
	poly.mLightLevel = lightlevel;
	poly.mVertCount = npoints;
	poly.mVertIndex = (int)mVertices.Reserve(npoints);

	bool dorotate = rotation != 0;

	float cosrot = cos(rotation.Radians());
	float sinrot = sin(rotation.Radians());

	float uscale = float(1.f / (texture->GetScaledWidth() * scalex));
	float vscale = float(1.f / (texture->GetScaledHeight() * scaley));
	if (texture->bHasCanvas)
	{
		vscale = 0 - vscale;
	}
	float ox = float(originx);
	float oy = float(originy);

	for (int i = 0; i < npoints; ++i)
	{
		float u = points[i].X - 0.5f - ox;
		float v = points[i].Y - 0.5f - oy;
		if (dorotate)
		{
			float t = u;
			u = t * cosrot - v * sinrot;
			v = v * cosrot + t * sinrot;
		}
		mVertices[poly.mVertIndex+i].Set(points[i].X, points[i].Y, 0, u*uscale, v*vscale);
	}
	AddData(&poly);
}